

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbisfile.c
# Opt level: O2

int ov_pcm_seek_page(OggVorbis_File *vf,ogg_int64_t pos)

{
  ogg_stream_state *os;
  ogg_int64_t *poVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  ogg_int64_t oVar6;
  long lVar7;
  long lVar8;
  ogg_int64_t oVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uStack_100;
  ulong local_f8;
  long local_f0;
  ulong local_d8;
  long local_b8;
  ogg_page og_1;
  ogg_page og;
  ogg_packet op;
  
  oVar6 = ov_pcm_total(vf,-1);
  if (vf->ready_state < 2) {
    return -0x83;
  }
  if (vf->seekable == 0) {
    return -0x8a;
  }
  if (oVar6 < pos || pos < 0) {
    return -0x83;
  }
  uVar15 = vf->links;
  uVar11 = (int)uVar15 >> 0x1f & uVar15;
  uVar5 = uVar11 - 1;
  poVar1 = vf->pcmlengths;
  iVar13 = uVar15 * 2;
  do {
    uVar12 = uVar15;
    if ((int)uVar12 < 1) {
      iVar13 = uVar5 * 2;
      uVar12 = uVar11;
      uVar15 = uVar5;
      break;
    }
    oVar6 = oVar6 - poVar1[iVar13 - 1];
    uVar15 = uVar12 - 1;
    iVar13 = iVar13 + -2;
  } while (pos < oVar6);
  uVar18 = vf->offsets[(int)uVar12];
  uVar16 = vf->dataoffsets[(int)uVar15];
  local_f0 = poVar1[iVar13];
  lVar8 = poVar1[iVar13 + 1];
  if (uVar16 == uVar18) {
    uVar5 = _seek_helper(vf,uVar18);
    if (uVar5 == 0) {
      uStack_100 = _get_next_page(vf,&og,1);
      if ((long)uStack_100 < 0) goto LAB_0019092e;
      bVar2 = true;
      goto LAB_001906f6;
    }
  }
  else {
    uStack_100 = 0;
    bVar2 = false;
LAB_001906f6:
    lVar7 = (pos - oVar6) + local_f0;
    local_d8 = 0xffffffffffffffff;
    lVar8 = lVar8 + local_f0;
LAB_00190716:
    local_b8 = lVar8;
    lVar8 = uVar18 - uVar16;
    if (lVar8 != 0 && (long)uVar16 <= (long)uVar18) {
      local_f8 = uVar16;
      if ((0xffff < lVar8) &&
         (local_f8 = (uVar16 + (long)(((double)lVar8 * (double)(lVar7 - local_f0)) /
                                     (double)(local_b8 - local_f0))) - 0x10000,
         (long)local_f8 < (long)(uVar16 + 0x10000))) {
        local_f8 = uVar16;
      }
      uVar5 = _seek_helper(vf,local_f8);
      if (uVar5 != 0) goto LAB_001906de;
      uVar17 = 0;
      bVar3 = bVar2;
LAB_0019079f:
      do {
        uVar14 = uVar18;
        uVar10 = uVar16 + 1;
        bVar2 = bVar3;
        bVar4 = bVar3;
        do {
          do {
            while( true ) {
              bVar3 = bVar2;
              uStack_100 = uVar17;
              uVar18 = uVar14;
              lVar8 = local_b8;
              bVar2 = bVar4;
              if ((long)uVar14 <= (long)uVar16) goto LAB_00190716;
              uStack_100 = _get_next_page(vf,&og,uVar14 - vf->offset);
              if (uStack_100 == 0xffffffffffffff80) {
                uStack_100 = 0xffffffffffffff80;
                goto LAB_0019092e;
              }
              uVar18 = uVar16;
              if (-1 < (long)uStack_100) break;
              uVar17 = uStack_100;
              if ((long)local_f8 <= (long)uVar10) goto LAB_0019079f;
              if (local_f8 == 0) goto LAB_0019092e;
              local_f8 = local_f8 - 0x10000;
              if ((long)local_f8 <= (long)uVar16) {
                local_f8 = uVar10;
              }
              uVar5 = _seek_helper(vf,local_f8);
              uVar17 = 0;
              bVar2 = bVar3;
              bVar4 = bVar3;
              if (uVar5 != 0) goto LAB_001906de;
            }
            iVar13 = ogg_page_serialno(&og);
            bVar2 = true;
          } while (vf->serialnos[(int)uVar15] != (long)iVar13);
          oVar9 = ogg_page_granulepos(&og);
          bVar3 = true;
          bVar2 = true;
        } while (oVar9 == -1);
        if (lVar7 <= oVar9) {
          uVar17 = uStack_100;
          if ((long)uVar10 < (long)local_f8) {
            uVar18 = local_f8;
            lVar8 = oVar9;
            if (uVar14 != vf->offset) break;
            local_f8 = local_f8 - 0x10000;
            if ((long)local_f8 <= (long)uVar16) {
              local_f8 = uVar10;
            }
            uVar5 = _seek_helper(vf,local_f8);
            bVar3 = true;
            uVar17 = 0;
            uVar18 = uStack_100;
            if (uVar5 != 0) goto LAB_001906de;
          }
          goto LAB_0019079f;
        }
        uVar16 = vf->offset;
        local_f0 = oVar9;
        uVar18 = uVar14;
        uVar17 = uStack_100;
        local_f8 = uVar16;
        local_d8 = uStack_100;
        bVar2 = bVar3;
      } while (lVar7 - oVar9 < 0xac45);
      goto LAB_00190716;
    }
    if (local_d8 == 0xffffffffffffffff) {
      if (((!bVar2) || (uVar16 != vf->dataoffsets[(int)uVar15])) ||
         (iVar13 = ogg_page_serialno(&og), vf->serialnos[(int)uVar15] != (long)iVar13))
      goto LAB_0019092e;
      vf->pcm_offset = oVar6;
      if (uVar15 == vf->current_link) {
        vorbis_synthesis_restart(&vf->vd);
        lVar8 = vf->current_serialno;
      }
      else {
        _decode_clear(vf);
        vf->current_link = uVar15;
        lVar8 = vf->serialnos[(int)uVar15];
        vf->current_serialno = lVar8;
        vf->ready_state = 3;
      }
      ogg_stream_reset_serialno(&vf->os,(int)lVar8);
      ogg_stream_pagein(&vf->os,&og);
      lVar8 = vf->pcm_offset;
      goto LAB_00190c5a;
    }
    uVar5 = _seek_helper(vf,local_d8);
    vf->pcm_offset = -1;
    if (uVar5 == 0) {
      uStack_100 = _get_next_page(vf,&og_1,-1);
      if (-1 < (long)uStack_100) {
        if (uVar15 == vf->current_link) {
          vorbis_synthesis_restart(&vf->vd);
          lVar8 = vf->current_serialno;
        }
        else {
          _decode_clear(vf);
          vf->current_link = uVar15;
          lVar8 = vf->serialnos[(int)uVar15];
          vf->current_serialno = lVar8;
          vf->ready_state = 3;
        }
        os = &vf->os;
        ogg_stream_reset_serialno(os,(int)lVar8);
        ogg_stream_pagein(os,&og_1);
        uStack_100 = 0xffffffffffffff80;
        do {
          iVar13 = ogg_stream_packetpeek(os,&op);
          uVar18 = local_d8;
          if (iVar13 == 0) {
            while (vf->dataoffsets[(int)uVar15] < (long)uVar18) {
              uVar16 = 0xffffffffffffffff;
              uVar17 = uVar18;
LAB_00190b12:
              if (uVar16 == 0xffffffffffffffff) {
                if ((long)uVar17 < 0x10001) {
                  uVar17 = 0x10000;
                }
                uVar17 = uVar17 - 0x10000;
                uVar5 = _seek_helper(vf,uVar17);
                if (uVar5 != 0) goto LAB_001906de;
                uVar10 = 0xffffffffffffffff;
                do {
                  uVar16 = uVar10;
                  lVar8 = uVar18 - vf->offset;
                  if (lVar8 == 0 || (long)uVar18 < vf->offset) break;
                  og_1.body = (uchar *)0x0;
                  og_1.body_len = 0;
                  og_1.header = (uchar *)0x0;
                  og_1.header_len = 0;
                  uVar10 = _get_next_page(vf,&og_1,lVar8);
                  if (uVar10 == 0xffffffffffffff80) goto LAB_0019092e;
                } while (-1 < (long)uVar10);
                goto LAB_00190b12;
              }
              if (og_1.header_len == 0) {
                uVar5 = _seek_helper(vf,uVar16);
                if (uVar5 != 0) goto LAB_001906de;
                oVar9 = _get_next_page(vf,&og_1,0x10000);
                if (oVar9 < 0) {
                  uStack_100 = 0xffffffffffffff7f;
                  goto LAB_0019092e;
                }
              }
              iVar13 = ogg_page_serialno(&og_1);
              uVar18 = uVar16;
              if ((vf->current_serialno == (long)iVar13) &&
                 ((oVar9 = ogg_page_granulepos(&og_1), -1 < oVar9 ||
                  (iVar13 = ogg_page_continued(&og_1), iVar13 == 0)))) {
                iVar13 = ov_raw_seek(vf,uVar16);
                return iVar13;
              }
            }
          }
          else {
            uVar18 = (ulong)iVar13;
          }
          if ((long)uVar18 < 0) {
            uStack_100 = 0xffffffffffffff78;
            break;
          }
          if (op.granulepos != -1) goto LAB_00190c9c;
          ogg_stream_packetout(os,(ogg_packet *)0x0);
        } while( true );
      }
      goto LAB_0019092e;
    }
  }
LAB_001906de:
  uStack_100 = (ulong)uVar5;
LAB_0019092e:
  vf->pcm_offset = -1;
  _decode_clear(vf);
  return (int)uStack_100;
LAB_00190c9c:
  lVar7 = op.granulepos - vf->pcmlengths[(long)vf->current_link * 2];
  lVar8 = 0;
  if (0 < lVar7) {
    lVar8 = lVar7;
  }
  lVar8 = lVar8 + oVar6;
  vf->pcm_offset = lVar8;
LAB_00190c5a:
  uStack_100 = 0xffffffffffffff7f;
  if ((lVar8 <= pos) && (oVar6 = ov_pcm_total(vf,-1), pos <= oVar6)) {
    vf->bittrack = 0.0;
    vf->samptrack = 0.0;
    return 0;
  }
  goto LAB_0019092e;
}

Assistant:

int ov_pcm_seek_page(OggVorbis_File *vf,ogg_int64_t pos){
  int link=-1;
  ogg_int64_t result=0;
  ogg_int64_t total=ov_pcm_total(vf,-1);

  if(vf->ready_state<OPENED)return(OV_EINVAL);
  if(!vf->seekable)return(OV_ENOSEEK);

  if(pos<0 || pos>total)return(OV_EINVAL);

  /* which bitstream section does this pcm offset occur in? */
  for(link=vf->links-1;link>=0;link--){
    total-=vf->pcmlengths[link*2+1];
    if(pos>=total)break;
  }

  /* Search within the logical bitstream for the page with the highest
     pcm_pos preceding pos.  If we're looking for a position on the
     first page, bisection will halt without finding our position as
     it's before the first explicit granulepos fencepost. That case is
     handled separately below.

     There is a danger here; missing pages or incorrect frame number
     information in the bitstream could make our task impossible.
     Account for that (it would be an error condition) */

  /* new search algorithm originally by HB (Nicholas Vinen) */

  {
    ogg_int64_t end=vf->offsets[link+1];
    ogg_int64_t begin=vf->dataoffsets[link];
    ogg_int64_t begintime = vf->pcmlengths[link*2];
    ogg_int64_t endtime = vf->pcmlengths[link*2+1]+begintime;
    ogg_int64_t target=pos-total+begintime;
    ogg_int64_t best=-1;
    int         got_page=0;

    ogg_page og;

    /* if we have only one page, there will be no bisection.  Grab the page here */
    if(begin==end){
      result=_seek_helper(vf,begin);
      if(result) goto seek_error;

      result=_get_next_page(vf,&og,1);
      if(result<0) goto seek_error;

      got_page=1;
    }

    /* bisection loop */
    while(begin<end){
      ogg_int64_t bisect;

      if(end-begin<CHUNKSIZE){
        bisect=begin;
      }else{
        /* take a (pretty decent) guess. */
        bisect=begin +
          (ogg_int64_t)((double)(target-begintime)*(end-begin)/(endtime-begintime))
          - CHUNKSIZE;
        if(bisect<begin+CHUNKSIZE)
          bisect=begin;
      }

      result=_seek_helper(vf,bisect);
      if(result) goto seek_error;

      /* read loop within the bisection loop */
      while(begin<end){
        result=_get_next_page(vf,&og,end-vf->offset);
        if(result==OV_EREAD) goto seek_error;
        if(result<0){
          /* there is no next page! */
          if(bisect<=begin+1)
              /* No bisection left to perform.  We've either found the
                 best candidate already or failed. Exit loop. */
            end=begin;
          else{
            /* We tried to load a fraction of the last page; back up a
               bit and try to get the whole last page */
            if(bisect==0) goto seek_error;
            bisect-=CHUNKSIZE;

            /* don't repeat/loop on a read we've already performed */
            if(bisect<=begin)bisect=begin+1;

            /* seek and cntinue bisection */
            result=_seek_helper(vf,bisect);
            if(result) goto seek_error;
          }
        }else{
          ogg_int64_t granulepos;
          got_page=1;

          /* got a page. analyze it */
          /* only consider pages from primary vorbis stream */
          if(ogg_page_serialno(&og)!=vf->serialnos[link])
            continue;

          /* only consider pages with the granulepos set */
          granulepos=ogg_page_granulepos(&og);
          if(granulepos==-1)continue;

          if(granulepos<target){
            /* this page is a successful candidate! Set state */

            best=result;  /* raw offset of packet with granulepos */
            begin=vf->offset; /* raw offset of next page */
            begintime=granulepos;

            /* if we're before our target but within a short distance,
               don't bisect; read forward */
            if(target-begintime>44100)break;

            bisect=begin; /* *not* begin + 1 as above */
          }else{

            /* This is one of our pages, but the granpos is
               post-target; it is not a bisection return
               candidate. (The only way we'd use it is if it's the
               first page in the stream; we handle that case later
               outside the bisection) */
            if(bisect<=begin+1){
              /* No bisection left to perform.  We've either found the
                 best candidate already or failed. Exit loop. */
              end=begin;
            }else{
              if(end==vf->offset){
                /* bisection read to the end; use the known page
                   boundary (result) to update bisection, back up a
                   little bit, and try again */
                end=result;
                bisect-=CHUNKSIZE;
                if(bisect<=begin)bisect=begin+1;
                result=_seek_helper(vf,bisect);
                if(result) goto seek_error;
              }else{
                /* Normal bisection */
                end=bisect;
                endtime=granulepos;
                break;
              }
            }
          }
        }
      }
    }

    /* Out of bisection: did it 'fail?' */
    if(best == -1){

      /* Check the 'looking for data in first page' special case;
         bisection would 'fail' because our search target was before the
         first PCM granule position fencepost. */

      if(got_page &&
         begin == vf->dataoffsets[link] &&
         ogg_page_serialno(&og)==vf->serialnos[link]){

        /* Yes, this is the beginning-of-stream case. We already have
           our page, right at the beginning of PCM data.  Set state
           and return. */

        vf->pcm_offset=total;

        if(link!=vf->current_link){
          /* Different link; dump entire decode machine */
          _decode_clear(vf);

          vf->current_link=link;
          vf->current_serialno=vf->serialnos[link];
          vf->ready_state=STREAMSET;

        }else{
          vorbis_synthesis_restart(&vf->vd);
        }

        ogg_stream_reset_serialno(&vf->os,vf->current_serialno);
        ogg_stream_pagein(&vf->os,&og);

      }else
        goto seek_error;

    }else{

      /* Bisection found our page. seek to it, update pcm offset. Easier case than
         raw_seek, don't keep packets preceding granulepos. */

      ogg_page og;
      ogg_packet op;

      /* seek */
      result=_seek_helper(vf,best);
      vf->pcm_offset=-1;
      if(result) goto seek_error;
      result=_get_next_page(vf,&og,-1);
      if(result<0) goto seek_error;

      if(link!=vf->current_link){
        /* Different link; dump entire decode machine */
        _decode_clear(vf);

        vf->current_link=link;
        vf->current_serialno=vf->serialnos[link];
        vf->ready_state=STREAMSET;

      }else{
        vorbis_synthesis_restart(&vf->vd);
      }

      ogg_stream_reset_serialno(&vf->os,vf->current_serialno);
      ogg_stream_pagein(&vf->os,&og);

      /* pull out all but last packet; the one with granulepos */
      while(1){
        result=ogg_stream_packetpeek(&vf->os,&op);
        if(result==0){
          /* No packet returned; we exited the bisection with 'best'
             pointing to a page with a granule position, so the packet
             finishing this page ('best') originated on a preceding
             page. Keep fetching previous pages until we get one with
             a granulepos or without the 'continued' flag set.  Then
             just use raw_seek for simplicity. */
          /* Do not rewind past the beginning of link data; if we do,
             it's either a bug or a broken stream */
          result=best;
          while(result>vf->dataoffsets[link]){
            result=_get_prev_page(vf,result,&og);
            if(result<0) goto seek_error;
            if(ogg_page_serialno(&og)==vf->current_serialno &&
               (ogg_page_granulepos(&og)>-1 ||
                !ogg_page_continued(&og))){
              return ov_raw_seek(vf,result);
            }
          }
        }
        if(result<0){
          result = OV_EBADPACKET;
          goto seek_error;
        }
        if(op.granulepos!=-1){
          vf->pcm_offset=op.granulepos-vf->pcmlengths[vf->current_link*2];
          if(vf->pcm_offset<0)vf->pcm_offset=0;
          vf->pcm_offset+=total;
          break;
        }else
          result=ogg_stream_packetout(&vf->os,NULL);
      }
    }
  }

  /* verify result */
  if(vf->pcm_offset>pos || pos>ov_pcm_total(vf,-1)){
    result=OV_EFAULT;
    goto seek_error;
  }
  vf->bittrack=0.f;
  vf->samptrack=0.f;
  return(0);

 seek_error:
  /* dump machine so we're in a known state */
  vf->pcm_offset=-1;
  _decode_clear(vf);
  return (int)result;
}